

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_0::InstrumentedProxy::runOnFunction
          (InstrumentedProxy *this,Module *module,Function *func)

{
  bool bVar1;
  pointer pPVar2;
  PassRunner *pPVar3;
  Function *func_local;
  Module *module_local;
  InstrumentedProxy *this_local;
  
  bVar1 = anon_unknown_0::ModuleAnalyzer::needsInstrumentation(this->analyzer,func);
  if (bVar1) {
    pPVar2 = std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::operator->(&this->pass);
    pPVar3 = Pass::getPassRunner(pPVar2);
    if (pPVar3 == (PassRunner *)0x0) {
      pPVar2 = std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::operator->
                         (&this->pass);
      pPVar3 = Pass::getPassRunner(&this->super_Pass);
      Pass::setPassRunner(pPVar2,pPVar3);
    }
    pPVar2 = std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::operator->(&this->pass);
    (*pPVar2->_vptr_Pass[3])(pPVar2,module,func);
  }
  return;
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    if (!analyzer->needsInstrumentation(func)) {
      return;
    }
    if (pass->getPassRunner() == nullptr) {
      pass->setPassRunner(getPassRunner());
    }
    pass->runOnFunction(module, func);
  }